

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O3

void __thiscall
Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register
          (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *this)

{
  RealCount *pRVar1;
  ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *alloc;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *pDVar6;
  
  if (this->cache == (PrototypeChainCache<Js::NoSpecialPropertyCache> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x4f,"(this->cache != nullptr)","this->cache != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (this->registration ==
      (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)0x0) {
    alloc = this->threadRegistry;
    pDVar6 = (DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
              *)new<Memory::ArenaAllocator>(0x18,&alloc->arena,0x364470);
    pDVar6[1].next.base =
         (DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
          *)this;
    pDVar2 = (alloc->scriptRegistrations).
             super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
             .next.base;
    pDVar6->prev = pDVar2->prev;
    (pDVar6->next).base = pDVar2;
    *(DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
      **)pDVar2->prev = pDVar6;
    (pDVar2->prev).base = pDVar6;
    pRVar1 = &(alloc->scriptRegistrations).super_RealCount;
    pRVar1->count = pRVar1->count + 1;
    this->registration =
         (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)(pDVar6 + 1);
  }
  return;
}

Assistant:

void
ScriptCacheRegistry<T>::Register()
{
    Assert(this->cache != nullptr);
    if (this->registration == nullptr)
    {
        this->registration = this->threadRegistry->Register(this);
    }
}